

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

bool __thiscall wabt::interp::Store::HasValueType(Store *this,Ref ref,ValueType type)

{
  bool bVar1;
  Enum EVar2;
  ObjectKind OVar3;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *this_00;
  pointer this_01;
  bool local_55;
  Object *obj;
  Store *this_local;
  Ref RStack_18;
  ValueType type_local;
  Ref ref_local;
  
  this_local._4_4_ = type.enum_;
  RStack_18.index = ref.index;
  bVar1 = IsValid(this,ref);
  if (bVar1) {
    EVar2 = Type::operator_cast_to_Enum((Type *)((long)&this_local + 4));
    if (EVar2 == Anyref) {
      ref_local.index._7_1_ = true;
    }
    else {
      bVar1 = interp::operator==(RStack_18,Ref::Null);
      if (bVar1) {
        ref_local.index._7_1_ = true;
      }
      else {
        this_00 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
                  ::Get(&this->objects_,RStack_18.index);
        this_01 = std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                  ::get(this_00);
        EVar2 = Type::operator_cast_to_Enum((Type *)((long)&this_local + 4));
        if (EVar2 == Exnref) {
          ref_local.index._7_1_ = false;
        }
        else if (EVar2 == Nullref) {
          ref_local.index._7_1_ = RStack_18.index == 0;
        }
        else if (EVar2 == Funcref) {
          OVar3 = Object::kind(this_01);
          local_55 = true;
          if (OVar3 != DefinedFunc) {
            OVar3 = Object::kind(this_01);
            local_55 = OVar3 == HostFunc;
          }
          ref_local.index._7_1_ = local_55;
        }
        else {
          ref_local.index._7_1_ = false;
        }
      }
    }
  }
  else {
    ref_local.index._7_1_ = false;
  }
  return ref_local.index._7_1_;
}

Assistant:

bool Store::HasValueType(Ref ref, ValueType type) const {
  // TODO opt?
  if (!IsValid(ref)) {
    return false;
  }
  if (type == ValueType::Anyref) {
    return true;
  }
  if (ref == Ref::Null) {
    return true;
  }

  Object* obj = objects_.Get(ref.index).get();
  switch (type) {
    case ValueType::Funcref:
      return obj->kind() == ObjectKind::DefinedFunc ||
             obj->kind() == ObjectKind::HostFunc;
    case ValueType::Nullref:
      return ref.index == 0;
    case ValueType::Exnref:  // TODO
      return false;
    default:
      return false;
  }
}